

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

unsigned_long duckdb::Cast::Operation<int,unsigned_long>(int input)

{
  bool bVar1;
  string *msg;
  unsigned_long result;
  int in_stack_000001ac;
  uint64_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  int32_t in_stack_ffffffffffffffc4;
  unsigned_long local_10;
  
  bVar1 = TryCast::Operation<int,unsigned_long>
                    (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<int,unsigned_long>(in_stack_000001ac);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return local_10;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}